

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O0

size_t __thiscall llvm::StringRef::rfind(StringRef *this,StringRef Str)

{
  unsigned_long *puVar1;
  char *__s1;
  bool bVar2;
  char *local_d8;
  char *local_d0;
  size_t local_c8;
  size_t e;
  size_t i;
  size_t N;
  StringRef *this_local;
  StringRef Str_local;
  unsigned_long local_88;
  size_t local_80;
  size_t local_78;
  StringRef *local_70;
  undefined1 local_68 [16];
  char **local_58;
  StringRef *local_50;
  char *local_48;
  char *local_40;
  StringRef *local_38;
  char *local_30;
  int local_24;
  char *local_20;
  char *local_18;
  undefined1 *local_10;
  
  i = Str.Length;
  this_local = (StringRef *)Str.Data;
  if ((char *)this->Length < i) {
    Str_local.Length = 0xffffffffffffffff;
  }
  else {
    e = (this->Length - i) + 1;
    local_c8 = 0;
    N = (size_t)this;
    Str_local.Data = (char *)i;
    do {
      if (e == local_c8) {
        return 0xffffffffffffffff;
      }
      e = e - 1;
      local_80 = i;
      local_78 = e;
      local_70 = this;
      puVar1 = std::min<unsigned_long>(&local_78,&this->Length);
      local_78 = *puVar1;
      __s1 = this->Data + local_78;
      local_88 = this->Length - local_78;
      puVar1 = std::min<unsigned_long>(&local_80,&local_88);
      local_d0 = (char *)*puVar1;
      local_10 = local_68;
      local_50 = this_local;
      local_48 = Str_local.Data;
      local_58 = &local_d8;
      bVar2 = false;
      local_d8 = __s1;
      local_20 = local_d0;
      local_18 = __s1;
      if (local_d0 == Str_local.Data) {
        local_38 = this_local;
        local_40 = Str_local.Data;
        local_30 = __s1;
        if (Str_local.Data == (char *)0x0) {
          local_24 = 0;
        }
        else {
          local_24 = memcmp(__s1,this_local,(size_t)Str_local.Data);
        }
        bVar2 = local_24 == 0;
      }
    } while (!bVar2);
    Str_local.Length = e;
  }
  return Str_local.Length;
}

Assistant:

size_t StringRef::rfind(StringRef Str) const {
  size_t N = Str.size();
  if (N > Length)
    return npos;
  for (size_t i = Length - N + 1, e = 0; i != e;) {
    --i;
    if (substr(i, N).equals(Str))
      return i;
  }
  return npos;
}